

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TFad<6,_double>,_3> * __thiscall
TPZManVector<TFad<6,_double>,_3>::operator=
          (TPZManVector<TFad<6,_double>,_3> *this,TPZManVector<TFad<6,_double>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  TFad<6,_double> *pTVar4;
  ulong uVar5;
  ulong *puVar6;
  TFad<6,_double> *pTVar7;
  TPZManVector<TFad<6,_double>,_3> *in_RSI;
  TPZManVector<TFad<6,_double>,_3> *in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t nel;
  TFad<6,_double> *in_stack_ffffffffffffff28;
  TFad<6,_double> *in_stack_ffffffffffffff30;
  TFad<6,_double> *local_b0;
  long local_30;
  
  if (in_RDI != in_RSI) {
    uVar3 = TPZVec<TFad<6,_double>_>::NElements(&in_RSI->super_TPZVec<TFad<6,_double>_>);
    if ((((in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc < (long)uVar3) &&
        ((in_RDI->super_TPZVec<TFad<6,_double>_>).fStore != (TFad<6,_double> *)0x0)) &&
       ((in_RDI->super_TPZVec<TFad<6,_double>_>).fStore != in_RDI->fExtAlloc)) {
      pTVar7 = (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore;
      if (pTVar7 != (TFad<6,_double> *)0x0) {
        dVar1 = pTVar7[-1].dx_[5];
        for (pTVar4 = pTVar7 + (long)dVar1; pTVar7 != pTVar4; pTVar4 = pTVar4 + -1) {
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x14afb7e);
        }
        operator_delete__(pTVar7[-1].dx_ + 5,(long)dVar1 * 0x40 + 8);
      }
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
    }
    if ((long)uVar3 < 4) {
      if (((in_RDI->super_TPZVec<TFad<6,_double>_>).fStore != in_RDI->fExtAlloc) &&
         (pTVar7 = (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore, pTVar7 != (TFad<6,_double> *)0x0
         )) {
        dVar1 = pTVar7[-1].dx_[5];
        for (pTVar4 = pTVar7 + (long)dVar1; pTVar7 != pTVar4; pTVar4 = pTVar4 + -1) {
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x14afc4d);
        }
        operator_delete__(pTVar7[-1].dx_ + 5,(long)dVar1 * 0x40 + 8);
      }
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = uVar3;
    }
    else if ((in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc < (long)uVar3) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3;
      uVar5 = SUB168(auVar2 * ZEXT816(0x40),0);
      uVar8 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x40),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar8);
      *puVar6 = uVar3;
      pTVar7 = (TFad<6,_double> *)(puVar6 + 1);
      if (uVar3 != 0) {
        local_b0 = pTVar7;
        do {
          TFad<6,_double>::TFad(in_stack_ffffffffffffff30);
          local_b0 = local_b0 + 1;
        } while (local_b0 != pTVar7 + uVar3);
      }
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = pTVar7;
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = uVar3;
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = uVar3;
    }
    else {
      (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = uVar3;
    }
    for (local_30 = 0; local_30 < (long)uVar3; local_30 = local_30 + 1) {
      TFad<6,_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}